

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O0

int __thiscall CDataFileWriter::AddDataSwapped(CDataFileWriter *this,int Size,void *pData)

{
  int iVar1;
  char *in_RDI;
  int unaff_retaddr;
  CDataFileWriter *in_stack_00000008;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  dbg_assert_imp(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,(char *)0x14788d);
  iVar1 = AddData(in_stack_00000008,unaff_retaddr,in_RDI);
  return iVar1;
}

Assistant:

int CDataFileWriter::AddDataSwapped(int Size, const void *pData)
{
	dbg_assert(Size%sizeof(int) == 0, "incorrect boundary");

#if defined(CONF_ARCH_ENDIAN_BIG)
	void *pSwapped = mem_alloc(Size); // temporary buffer that we use during compression
	mem_copy(pSwapped, pData, Size);
	swap_endian(pSwapped, sizeof(int), Size/sizeof(int));
	int Index = AddData(Size, pSwapped);
	mem_free(pSwapped);
	return Index;
#else
	return AddData(Size, pData);
#endif
}